

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_error.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  domain_type *pdVar2;
  const_pointer pcVar3;
  const_pointer pcVar4;
  errc local_88 [4];
  string_ref local_78;
  string_ref local_48;
  undefined1 local_18 [8];
  error e;
  
  _local_18 = (status_code_storage<system_error2::detail::erased<long,_true>_>)open_resource();
  pdVar2 = system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>::
           domain((status_code_storage<system_error2::detail::erased<long,_true>_> *)local_18);
  (**pdVar2->_vptr_status_code_domain)();
  pcVar3 = system_error2::status_code_domain::string_ref::c_str(&local_48);
  system_error2::status_code<void>::message(&local_78,(status_code<void> *)local_18);
  pcVar4 = system_error2::status_code_domain::string_ref::c_str(&local_78);
  printf("Returned error has a code domain of \'%s\', a message of \'%s\'\n",pcVar3,pcVar4);
  system_error2::status_code_domain::string_ref::~string_ref(&local_78);
  system_error2::status_code_domain::string_ref::~string_ref(&local_48);
  local_88[0] = operation_not_permitted;
  bVar1 = system_error2::
          operator==<system_error2::detail::erased<long,_true>,_system_error2::errc,_system_error2::status_code<system_error2::_generic_code_domain>,_true>
                    ((errored_status_code<system_error2::detail::erased<long,_true>_> *)local_18,
                     local_88);
  printf("\nAnd semantically comparing it to \'errc::operation_not_permitted\' = %d\n",(ulong)bVar1)
  ;
  system_error2::errored_status_code<system_error2::detail::erased<long,_true>_>::
  ~errored_status_code((errored_status_code<system_error2::detail::erased<long,_true>_> *)local_18);
  return 0;
}

Assistant:

int main(void)
{
  error e = open_resource();
  // A quick demonstration that the indirection works as indicated
  printf("Returned error has a code domain of '%s', a message of '%s'\n", e.domain().name().c_str(), e.message().c_str());
  printf("\nAnd semantically comparing it to 'errc::operation_not_permitted' = %d\n", e == errc::operation_not_permitted);
}